

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O1

void __thiscall
vigra::BmpInfoHeader::from_stream(BmpInfoHeader *this,ifstream *stream,byteorder *bo)

{
  PreconditionViolation *this_00;
  uint uVar1;
  
  read_field<unsigned_int>(stream,bo,&this->info_size);
  if (this->info_size < 0x28) {
    this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
    PreconditionViolation::PreconditionViolation
              (this_00,"info header has a wrong size",
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx"
               ,0xae);
  }
  else {
    read_field<int>(stream,bo,&this->width);
    if (this->width < 1) {
      this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
      PreconditionViolation::PreconditionViolation
                (this_00,"width must be > 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx"
                 ,0xb0);
    }
    else {
      read_field<int>(stream,bo,&this->height);
      if (this->height < 1) {
        this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
        PreconditionViolation::PreconditionViolation
                  (this_00,"height must be > 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx"
                   ,0xb2);
      }
      else {
        read_field<unsigned_short>(stream,bo,&this->planes);
        if (this->planes == 1) {
          read_field<unsigned_short>(stream,bo,&this->bit_count);
          if ((this->bit_count < 0x19) && ((0x1000112U >> (this->bit_count & 0x1f) & 1) != 0)) {
            read_field<unsigned_int>(stream,bo,&this->compression);
            read_field<unsigned_int>(stream,bo,&this->image_size);
            if (this->image_size == 0) {
              this->image_size =
                   ((uint)(this->bit_count == 0x18) * 2 + 1) * this->width * this->height;
            }
            read_field<int>(stream,bo,&this->x_pixels_per_meter);
            read_field<int>(stream,bo,&this->y_pixels_per_meter);
            read_field<unsigned_int>(stream,bo,&this->clr_used);
            uVar1 = 1 << ((byte)this->bit_count & 0x1f);
            if (uVar1 < this->clr_used) {
              this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
              PreconditionViolation::PreconditionViolation
                        (this_00,"used colors field invalid",
                         "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx"
                         ,0xc3);
            }
            else {
              read_field<unsigned_int>(stream,bo,&this->clr_important);
              if (this->clr_important <= uVar1) {
                std::istream::seekg((long)stream,this->info_size - 0x28);
                return;
              }
              this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
              PreconditionViolation::PreconditionViolation
                        (this_00,"important colors field invalid",
                         "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx"
                         ,0xc6);
            }
          }
          else {
            this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
            PreconditionViolation::PreconditionViolation
                      (this_00,"illegal bit count",
                       "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx"
                       ,0xb7);
          }
        }
        else {
          this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
          PreconditionViolation::PreconditionViolation
                    (this_00,"planes must be 1",
                     "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx"
                     ,0xb4);
        }
      }
    }
  }
  __cxa_throw(this_00,&PreconditionViolation::typeinfo,ContractViolation::~ContractViolation);
}

Assistant:

void BmpInfoHeader::from_stream( std::ifstream & stream, byteorder & bo )
{
    const UInt32 info_impl_size = 40;
    read_field( stream, bo, info_size );
    vigra_precondition( info_size >= info_impl_size,
                        "info header has a wrong size" );
    read_field( stream, bo, width );
    vigra_precondition( width > 0, "width must be > 0" );
    read_field( stream, bo, height );
    vigra_precondition( height > 0, "height must be > 0" );
    read_field( stream, bo, planes );
    vigra_precondition( planes == 1, "planes must be 1" );
    read_field( stream, bo, bit_count );
    vigra_precondition( bit_count == 1 || bit_count == 4 || bit_count == 8
                        || bit_count == 24, "illegal bit count" );
    read_field( stream, bo, compression );
    read_field( stream, bo, image_size );
    if(image_size == 0)
    {
        image_size = height * width * ((bit_count == 24) ? 3 : 1);
    }
    read_field( stream, bo, x_pixels_per_meter );
    read_field( stream, bo, y_pixels_per_meter );
    read_field( stream, bo, clr_used );
    const unsigned int max_colors = 1 << bit_count;
    vigra_precondition( clr_used <= max_colors,
                        "used colors field invalid" );
    read_field( stream, bo, clr_important );
    vigra_precondition( clr_important <= max_colors,
                        "important colors field invalid" );
    // skip any padding
    stream.seekg( info_size - info_impl_size, std::ios::cur );
}